

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  BYTE *pBVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  uint *puVar14;
  char cVar15;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  BYTE *pBVar25;
  bool bVar26;
  U32 dummy32;
  BYTE *pInLoopLimit;
  uint local_d8;
  uint local_cc;
  uint *local_c0;
  uint local_9c;
  BYTE *local_98;
  BYTE *local_90;
  ulong local_88;
  BYTE *local_80;
  ulong *local_78;
  BYTE *local_70;
  ulong *local_68;
  ulong *local_60;
  ulong *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ulong local_40;
  ulong local_38;
  
  cVar15 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar22 = -0x30e4432345000000;
    break;
  case 6:
    lVar22 = -0x30e4432340650000;
    break;
  case 7:
    lVar22 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar22 = -0x30e44323485a9b9d;
    break;
  default:
    uVar21 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar15 & 0x1fU));
    goto LAB_001755b4;
  }
  uVar21 = (ulong)(lVar22 * *(long *)ip) >> (-cVar15 & 0x3fU);
LAB_001755b4:
  uVar18 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar6 = (ms->window).base;
  uVar20 = (int)ip - (int)pBVar6;
  uVar19 = uVar20 - uVar18;
  if (uVar20 < uVar18) {
    uVar19 = 0;
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x472d,
                  "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                 );
  }
  pUVar7 = ms->chainTable;
  uVar3 = ms->hashTable[uVar21];
  local_90 = (ms->window).dictBase;
  uVar16 = (ulong)(ms->window).dictLimit;
  uVar4 = (ms->window).lowLimit;
  uVar5 = (ms->cParams).searchLog;
  ms->hashTable[uVar21] = uVar20;
  if (uVar4 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4730,
                  "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                 );
  }
  local_d8 = uVar20 + 9;
  uVar21 = (ulong)((uVar20 & uVar18) * 2);
  local_c0 = pUVar7 + uVar21;
  puVar17 = pUVar7 + uVar21 + 1;
  uVar21 = 8;
  if (uVar3 < uVar4) {
LAB_00175651:
    *puVar17 = 0;
    *local_c0 = 0;
    uVar18 = local_d8 - (uVar20 + 8);
    if (local_d8 < uVar20 + 8 || uVar18 == 0) {
      __assert_fail("matchEndIdx > current + 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4773,
                    "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                   );
    }
    uVar20 = (int)uVar21 - 0x180;
    uVar19 = 0xc0;
    if (uVar20 < 0xc0) {
      uVar19 = uVar20;
    }
    uVar20 = 0;
    if (0x180 < uVar21) {
      uVar20 = uVar19;
    }
    if (uVar20 <= uVar18) {
      uVar20 = uVar18;
    }
    return uVar20;
  }
  local_48 = local_90 + uVar16;
  local_50 = pBVar6 + uVar16;
  local_cc = ~(-1 << ((byte)uVar5 & 0x1f));
  local_58 = (ulong *)(iend + -7);
  local_60 = (ulong *)(iend + -3);
  local_68 = (ulong *)(iend + -1);
  local_98 = pBVar6 + 8;
  local_70 = ip + 8;
  uVar11 = 0;
  uVar12 = 0;
  local_88 = (ulong)uVar20;
  local_80 = ip;
  local_78 = (ulong *)iend;
  do {
    uVar24 = (ulong)uVar3;
    uVar10 = uVar12;
    if (uVar11 < uVar12) {
      uVar10 = uVar11;
    }
    local_40 = uVar12;
    local_38 = uVar11;
    if ((uint)local_88 <= uVar3) {
      __assert_fail("matchIndex < current",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4734,
                    "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                   );
    }
    uVar12 = uVar10 + uVar24;
    if ((extDict == 0) || (uVar16 <= uVar12)) {
      if (uVar12 < uVar16) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x474c,
                      "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                     );
      }
      puVar2 = (ulong *)(local_80 + uVar10);
      puVar23 = (ulong *)(pBVar6 + uVar24 + uVar10);
      puVar13 = puVar2;
      if (puVar2 < local_58) {
        if (*puVar23 == *puVar2) {
          lVar22 = 0;
          do {
            puVar13 = (ulong *)(local_70 + lVar22 + uVar10);
            if (local_58 <= puVar13) {
              puVar23 = (ulong *)(local_98 + uVar12 + lVar22);
              goto LAB_00175838;
            }
            lVar8 = lVar22 + uVar12;
            lVar22 = lVar22 + 8;
          } while (*(ulong *)(local_98 + lVar8) == *puVar13);
          uVar11 = *puVar13 ^ *(ulong *)(local_98 + lVar8);
          uVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar12 = (uVar12 >> 3 & 0x1fffffff) + lVar22;
        }
        else {
          uVar11 = *puVar2 ^ *puVar23;
          uVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar12 = uVar12 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00175838:
        if ((puVar13 < local_60) && ((int)*puVar23 == (int)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar13 < local_68) && ((short)*puVar23 == (short)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar13 < local_78) {
          puVar13 = (ulong *)((long)puVar13 + (ulong)((byte)*puVar23 == (byte)*puVar13));
        }
        uVar12 = (long)puVar13 - (long)puVar2;
      }
      uVar10 = uVar12 + uVar10;
      pBVar25 = pBVar6 + uVar24;
    }
    else {
      pBVar1 = local_90 + uVar24;
      sVar9 = ZSTD_count_2segments
                        (local_80 + uVar10,pBVar1 + uVar10,(BYTE *)local_78,local_48,local_50);
      uVar10 = sVar9 + uVar10;
      pBVar25 = pBVar6 + uVar24;
      if (uVar10 + uVar24 < uVar16) {
        pBVar25 = pBVar1;
      }
    }
    if ((uVar21 < uVar10) && (uVar21 = uVar10, local_d8 - uVar3 < uVar10)) {
      local_d8 = (int)uVar10 + uVar3;
    }
    uVar20 = (uint)local_88;
    if ((ulong *)(local_80 + uVar10) == local_78) goto LAB_00175651;
    puVar14 = pUVar7 + (uVar3 & uVar18) * 2;
    if (pBVar25[uVar10] < (byte)*(ulong *)(local_80 + uVar10)) {
      *local_c0 = uVar3;
      if (uVar3 <= uVar19) {
        local_c0 = &local_9c;
        goto LAB_00175651;
      }
      puVar14 = puVar14 + 1;
      uVar12 = local_40;
      uVar11 = uVar10;
      local_c0 = puVar14;
    }
    else {
      *puVar17 = uVar3;
      puVar17 = puVar14;
      uVar12 = uVar10;
      uVar11 = local_38;
      if (uVar3 <= uVar19) {
        puVar17 = &local_9c;
        goto LAB_00175651;
      }
    }
    bVar26 = local_cc == 0;
    local_cc = local_cc - 1;
    if ((bVar26) || (uVar3 = *puVar14, uVar3 < uVar4)) goto LAB_00175651;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > current + 8);
        return MAX(positions, matchEndIdx - (current + 8));
    }
}